

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-double-page-size.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  reference pQVar6;
  ostream *poVar7;
  char *local_100;
  exception *e;
  QPDFWriter w;
  QPDFObjectHandle local_e0;
  reference local_d0;
  QPDFPageObjectHelper *page;
  iterator __end1;
  iterator __begin1;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_98 [24];
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *local_80;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *__range1;
  QPDF qpdf;
  allocator<char> local_59;
  string local_58 [8];
  string content;
  char *password;
  char *outfilename;
  char *infilename;
  char **ppcStack_18;
  bool static_id;
  char **argv_local;
  int argc_local;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  bVar3 = false;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  if (1 < argc) {
    iVar5 = strcmp(argv[1]," --static-id");
    if (iVar5 == 0) {
      bVar3 = true;
      argv_local._0_4_ = argc + -1;
      ppcStack_18 = argv + 1;
    }
  }
  if (((int)argv_local != 3) && ((int)argv_local != 4)) {
    usage();
  }
  pcVar1 = ppcStack_18[1];
  pcVar2 = ppcStack_18[2];
  if ((int)argv_local == 4) {
    local_100 = ppcStack_18[3];
  }
  else {
    local_100 = "";
  }
  content.field_2._8_8_ = local_100;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"2 0 0 2 0 0 cm\n",&local_59);
  std::allocator<char>::~allocator(&local_59);
  QPDF::QPDF((QPDF *)&__range1);
  QPDF::processFile((char *)&__range1,pcVar1);
  QPDFPageDocumentHelper::QPDFPageDocumentHelper
            ((QPDFPageDocumentHelper *)&__begin1,(QPDF *)&__range1);
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&__begin1);
  local_80 = local_98;
  __end1 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::begin(local_80)
  ;
  page = (QPDFPageObjectHelper *)
         std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::end(local_80);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
                                *)&page);
    if (!bVar4) break;
    pQVar6 = __gnu_cxx::
             __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
             ::operator*(&__end1);
    local_d0 = pQVar6;
    QPDF::newStream((string *)&local_e0);
    QPDFPageObjectHelper::addPageContents((QPDFObjectHandle *)pQVar6,SUB81(&local_e0,0));
    QPDFObjectHandle::~QPDFObjectHandle(&local_e0);
    doubleBoxSize(local_d0,"/MediaBox");
    doubleBoxSize(local_d0,"/CropBox");
    doubleBoxSize(local_d0,"/BleedBox");
    doubleBoxSize(local_d0,"/TrimBox");
    doubleBoxSize(local_d0,"/ArtBox");
    __gnu_cxx::
    __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
    ::operator++(&__end1);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(local_98);
  QPDFWriter::QPDFWriter((QPDFWriter *)&e,(QPDF *)&__range1,pcVar2);
  if (bVar3) {
    QPDFWriter::setStaticID(SUB81(&e,0));
    QPDFWriter::setStreamDataMode((qpdf_stream_data_e)&e);
  }
  QPDFWriter::write();
  poVar7 = std::operator<<((ostream *)&std::cout,whoami);
  poVar7 = std::operator<<(poVar7,": new file written to ");
  poVar7 = std::operator<<(poVar7,pcVar2);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  QPDFWriter::~QPDFWriter((QPDFWriter *)&e);
  QPDF::~QPDF((QPDF *)&__range1);
  std::__cxx11::string::~string(local_58);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    // For test suite
    bool static_id = false;
    if ((argc > 1) && (strcmp(argv[1], " --static-id") == 0)) {
        static_id = true;
        --argc;
        ++argv;
    }

    if (!((argc == 3) || (argc == 4))) {
        usage();
    }

    char const* infilename = argv[1];
    char const* outfilename = argv[2];
    char const* password = (argc == 4) ? argv[3] : "";

    // Text to prepend to each page's contents
    std::string content = "2 0 0 2 0 0 cm\n";

    try {
        QPDF qpdf;
        qpdf.processFile(infilename, password);

        for (auto& page: QPDFPageDocumentHelper(qpdf).getAllPages()) {
            // Prepend the buffer to the page's contents
            page.addPageContents(qpdf.newStream(content), true);

            // Double the size of each of the content boxes
            doubleBoxSize(page, "/MediaBox");
            doubleBoxSize(page, "/CropBox");
            doubleBoxSize(page, "/BleedBox");
            doubleBoxSize(page, "/TrimBox");
            doubleBoxSize(page, "/ArtBox");
        }

        // Write out a new file
        QPDFWriter w(qpdf, outfilename);
        if (static_id) {
            // For the test suite, uncompress streams and use static IDs.
            w.setStaticID(true); // for testing only
            w.setStreamDataMode(qpdf_s_uncompress);
        }
        w.write();
        std::cout << whoami << ": new file written to " << outfilename << std::endl;
    } catch (std::exception& e) {
        std::cerr << whoami << " processing file " << infilename << ": " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}